

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O3

int gdImageTrueColorToPaletteBody(gdImagePtr oim,int dither,int colorsWanted,gdImagePtr *cimP)

{
  size_t size;
  int **ppiVar1;
  int iVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar **ppuVar8;
  gdImagePtr pgVar9;
  my_cquantize_ptr cquantize;
  hist3d ppahVar10;
  void *pvVar11;
  FSERRPTR pFVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  boxptr boxp;
  int *piVar16;
  gdImagePtr pgVar17;
  long lVar18;
  ushort uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  my_cquantize_ptr cquantize_00;
  my_cquantize_ptr cquantize_01;
  long lVar23;
  int i;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  gdImagePtr nim;
  long lVar30;
  int iVar31;
  uint c1;
  histcell *phVar32;
  uint *puVar33;
  char cVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  short sVar40;
  int i_1;
  short *psVar41;
  uint uVar42;
  int iVar43;
  uchar *puVar44;
  bool bVar45;
  gdImagePtr local_100;
  int *local_f8;
  short local_d8;
  hist3d histogram;
  long local_a0;
  
  if (cimP == (gdImagePtr *)0x0) {
    if (oim->trueColor == 0) {
      return 1;
    }
    uVar37 = 0xff - (oim->transparent >> 0x1f);
    uVar36 = (ulong)uVar37;
    if (colorsWanted <= (int)uVar37) {
      uVar36 = (ulong)(uint)colorsWanted;
    }
    iVar21 = (int)uVar36;
    ppuVar8 = (uchar **)gdCalloc(8,(long)oim->sy);
    oim->pixels = ppuVar8;
    if (ppuVar8 != (uchar **)0x0) {
      local_100 = oim;
      if (0 < oim->sy) {
        cquantize = (my_cquantize_ptr)0x0;
        lVar24 = 0;
        do {
          puVar44 = (uchar *)gdCalloc(1,(long)oim->sx);
          oim->pixels[lVar24] = puVar44;
          if (oim->pixels[lVar24] == (uchar *)0x0) goto LAB_0011ff1c;
          lVar24 = lVar24 + 1;
        } while (lVar24 < oim->sy);
      }
      if (oim->paletteQuantizationMethod == 2) goto LAB_0011fa32;
      goto LAB_0011fb0d;
    }
    if (oim->trueColor == 0) {
      return 0;
    }
    cquantize = (my_cquantize_ptr)0x0;
  }
  else {
    local_100 = gdImageCreate(oim->sx,oim->sy);
    *cimP = local_100;
    if (local_100 == (gdImagePtr)0x0) {
      return 0;
    }
    if (oim->trueColor == 0) {
      gdImageCopy(local_100,oim,0,0,0,0,oim->sx,oim->sy);
      *cimP = local_100;
      return 1;
    }
    uVar37 = 0xff - (oim->transparent >> 0x1f);
    uVar36 = (ulong)uVar37;
    if (colorsWanted <= (int)uVar37) {
      uVar36 = (ulong)(uint)colorsWanted;
    }
    iVar21 = (int)uVar36;
    if (oim->paletteQuantizationMethod == 2) {
      gdImageDestroy(local_100);
LAB_0011fa32:
      iVar20 = 2;
      if (oim->paletteQuantizationSpeed != 0) {
        iVar20 = oim->paletteQuantizationSpeed;
      }
      pgVar9 = gdImageNeuQuant(oim,iVar21,iVar20);
      if (cimP != (gdImagePtr *)0x0) {
        *cimP = pgVar9;
      }
      if (pgVar9 != (gdImagePtr)0x0) {
        free_truecolor_image_data(oim);
        gdImageCopy(oim,pgVar9,0,0,0,0,oim->sx,oim->sy);
        gdImageDestroy(pgVar9);
        return 1;
      }
      return 0;
    }
LAB_0011fb0d:
    local_f8 = &oim->transparent;
    uVar37 = (uint)uVar36;
    cquantize = (my_cquantize_ptr)gdCalloc(0x28,1);
    if (cquantize == (my_cquantize_ptr)0x0) {
      cquantize = (my_cquantize_ptr)0x0;
    }
    else {
      lVar24 = 0;
      cquantize->fserrors = (FSERRPTR)0x0;
      cquantize->error_limiter = (int *)0x0;
      ppahVar10 = (hist3d)gdMalloc(0x100);
      cquantize->histogram = ppahVar10;
      do {
        pvVar11 = gdMalloc(0x1000);
        boxp = (boxptr)cquantize->histogram;
        *(void **)(&boxp->c0min + lVar24 * 2) = pvVar11;
        if (cquantize->histogram[lVar24] == (hist2d)0x0) goto LAB_0011ff1c;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x20);
      pFVar12 = (FSERRPTR)gdMalloc(6);
      cquantize->fserrors = pFVar12;
      piVar13 = (int *)gdMalloc(0x7fc);
      cquantize->error_limiter_storage = piVar13;
      if (piVar13 != (int *)0x0) {
        piVar16 = piVar13 + 0xff;
        cquantize->error_limiter = piVar16;
        lVar24 = 0;
        lVar29 = 0;
        do {
          piVar16[lVar29] = (int)lVar29;
          piVar16[lVar24] = (int)lVar24;
          lVar29 = lVar29 + 1;
          lVar24 = lVar24 + -1;
        } while (lVar24 != -0x10);
        piVar16 = piVar13 + 0xef;
        iVar21 = 0x10;
        lVar24 = 0;
        do {
          piVar13[lVar24 + 0x10f] = iVar21;
          *piVar16 = -iVar21;
          iVar21 = iVar21 + ((int)lVar24 + 0x10U & 1);
          lVar24 = lVar24 + 1;
          piVar16 = piVar16 + -1;
        } while (lVar24 != 0x20);
        boxp = (boxptr)(piVar13 + 0xcf);
        lVar24 = 0;
        do {
          piVar13[lVar24 + 0x12f] = 0x20;
          boxp->c0min = -0x20;
          lVar24 = lVar24 + 1;
          boxp = (boxptr)((long)&boxp[-1].colorcount + 4);
        } while (lVar24 != 0xd0);
      }
      size = (long)local_100->sx * 6 + 0xc;
      pFVar12 = (FSERRPTR)gdReallocEx(cquantize->fserrors,size);
      cquantize->fserrors = pFVar12;
      if (pFVar12 != (FSERRPTR)0x0) {
        lVar24 = 0;
        memset(pFVar12,0,size);
        cquantize->on_odd_row = 0;
        ppahVar10 = cquantize->histogram;
        do {
          memset(ppahVar10[lVar24],0,0x1000);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x20);
        iVar21 = oim->sy;
        if (0 < (long)iVar21) {
          boxp = (boxptr)cquantize->histogram;
          iVar20 = oim->sx;
          ppiVar1 = oim->tpixels;
          lVar24 = 0;
          do {
            if (0 < iVar20) {
              puVar33 = (uint *)ppiVar1[lVar24];
              uVar22 = *local_f8;
              iVar35 = iVar20 + 1;
              do {
                uVar42 = *puVar33;
                if (((int)uVar22 < 0) || (uVar42 != uVar22)) {
                  lVar29 = (ulong)(uVar42 >> 4 & 0xfc0) +
                           *(long *)((long)&boxp->c0min + (ulong)(uVar42 >> 0x10 & 0xf8));
                  uVar25 = (ulong)(uVar42 >> 2 & 0x3e);
                  sVar3 = *(short *)(uVar25 + lVar29);
                  sVar40 = sVar3 + 1;
                  if (sVar40 == 0) {
                    sVar40 = sVar3;
                  }
                  *(short *)(uVar25 + lVar29) = sVar40;
                }
                puVar33 = puVar33 + 1;
                iVar35 = iVar35 + -1;
              } while (1 < iVar35);
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != iVar21);
        }
        iVar21 = overflow2(uVar37,0x28);
        if ((iVar21 == 0) &&
           (pgVar9 = (gdImagePtr)gdMalloc((long)(int)uVar37 * 0x28), pgVar9 != (gdImagePtr)0x0)) {
          pgVar9->pixels = (uchar **)0x1f00000000;
          pgVar9->sx = 0;
          pgVar9->sy = 0x3f;
          pgVar9->colorsTotal = 0;
          pgVar9->red[0] = 0x1f;
          update_box((gdImagePtr)cquantize->histogram,pgVar9,cquantize_00,boxp);
          uVar22 = 1;
          if ((int)uVar37 < 2) {
LAB_0012000b:
            ppahVar10 = cquantize->histogram;
            uVar36 = 0;
            do {
              lVar24 = (long)pgVar9->red[uVar36 * 10 + -5];
              if (pgVar9->red[uVar36 * 10 + -4] < pgVar9->red[uVar36 * 10 + -5]) {
LAB_00120196:
                iVar21 = 0xff;
                local_100->red[uVar36] = 0xff;
                local_100->green[uVar36] = 0xff;
              }
              else {
                iVar21 = pgVar9->red[uVar36 * 10 + -1];
                iVar20 = pgVar9->red[uVar36 * 10 + -3];
                lVar18 = 0;
                lVar30 = 0;
                lVar29 = 0;
                lVar26 = 0;
                do {
                  if (iVar20 <= pgVar9->red[uVar36 * 10 + -2]) {
                    phVar32 = ppahVar10[lVar24][iVar20] + iVar21;
                    lVar39 = (long)iVar20;
                    do {
                      if (iVar21 <= pgVar9->red[uVar36 * 10]) {
                        lVar23 = 0;
                        iVar35 = iVar21 * 8 + 4;
                        do {
                          uVar25 = (ulong)phVar32[lVar23];
                          if (uVar25 != 0) {
                            lVar26 = lVar26 + uVar25;
                            lVar29 = lVar29 + uVar25 * (long)((int)lVar24 * 8 + 4);
                            lVar30 = lVar30 + uVar25 * (long)((int)lVar39 * 4 + 2);
                            lVar18 = lVar18 + (long)iVar35 * uVar25;
                          }
                          lVar23 = lVar23 + 1;
                          iVar35 = iVar35 + 8;
                        } while ((pgVar9->red[uVar36 * 10] - iVar21) + 1 != (int)lVar23);
                      }
                      lVar39 = lVar39 + 1;
                      phVar32 = phVar32 + 0x20;
                    } while (pgVar9->red[uVar36 * 10 + -2] + 1 != (int)lVar39);
                  }
                  lVar24 = lVar24 + 1;
                } while (pgVar9->red[uVar36 * 10 + -4] + 1 != (int)lVar24);
                if (lVar26 == 0) goto LAB_00120196;
                lVar24 = lVar26 >> 1;
                local_100->red[uVar36] = (int)((lVar29 + lVar24) / lVar26);
                local_100->green[uVar36] = (int)((lVar30 + lVar24) / lVar26);
                iVar21 = (int)((lVar18 + lVar24) / lVar26);
              }
              local_100->blue[uVar36] = iVar21;
              local_100->open[uVar36] = 0;
              uVar36 = uVar36 + 1;
            } while (uVar36 != uVar22);
          }
          else {
            uVar25 = 1;
            do {
              if (uVar36 < uVar25 * 2) {
                nim = (gdImagePtr)0x0;
                iVar21 = 0;
                uVar14 = uVar25;
                pgVar17 = pgVar9;
                do {
                  if (iVar21 < pgVar17->red[1]) {
                    nim = pgVar17;
                    iVar21 = pgVar17->red[1];
                  }
                  pgVar17 = (gdImagePtr)(pgVar17->red + 5);
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              else {
                nim = (gdImagePtr)0x0;
                lVar24 = 0;
                uVar14 = uVar25;
                pgVar17 = pgVar9;
                do {
                  if ((lVar24 < *(long *)(pgVar17->red + 3)) && (0 < pgVar17->red[1])) {
                    lVar24 = *(long *)(pgVar17->red + 3);
                    nim = pgVar17;
                  }
                  pgVar17 = (gdImagePtr)(pgVar17->red + 5);
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              if (nim == (gdImagePtr)0x0) {
                uVar22 = (uint)uVar25;
                break;
              }
              iVar21 = *(int *)((long)&nim->pixels + 4);
              pgVar9->red[uVar25 * 10 + -4] = iVar21;
              iVar20 = nim->sy;
              pgVar9->red[uVar25 * 10 + -2] = iVar20;
              iVar35 = nim->red[0];
              pgVar9->red[uVar25 * 10] = iVar35;
              iVar15 = *(int *)&nim->pixels;
              pgVar9->red[uVar25 * 10 + -5] = iVar15;
              iVar31 = nim->sx;
              pgVar9->red[uVar25 * 10 + -3] = iVar31;
              iVar4 = nim->colorsTotal;
              iVar27 = (iVar21 - iVar15) * 0x10;
              iVar5 = (iVar20 - iVar31) * 0xc;
              bVar45 = iVar27 + (iVar20 - iVar31) * -0xc < 0;
              iVar6 = iVar27;
              if (iVar27 == iVar5 || SBORROW4(iVar27,iVar5) != bVar45) {
                iVar6 = iVar5;
              }
              cVar34 = iVar27 == iVar5 || SBORROW4(iVar27,iVar5) != bVar45;
              pgVar9->red[uVar25 * 10 + -1] = iVar4;
              if (iVar6 < (iVar35 - iVar4) * 8) {
                cVar34 = '\x02';
              }
              if (cVar34 == '\x02') {
                piVar13 = nim->red;
                lVar24 = uVar25 * 0x28 + 0x10;
                iVar31 = iVar4 + iVar35;
LAB_0011feab:
                pgVar17 = (gdImagePtr)((long)pgVar9->red + lVar24 + -0x14);
              }
              else {
                if (cVar34 == '\x01') {
                  piVar13 = &nim->sy;
                  lVar24 = uVar25 * 0x28 + 8;
                  iVar31 = iVar31 + iVar20;
                  goto LAB_0011feab;
                }
                piVar13 = (int *)((long)&nim->pixels + 4);
                iVar31 = iVar15 + iVar21;
                pgVar17 = (gdImagePtr)(pgVar9->red + uVar25 * 10 + -5);
              }
              *piVar13 = iVar31 / 2;
              uVar22 = iVar31 / 2 + 1;
              *(uint *)&pgVar17->pixels = uVar22;
              update_box((gdImagePtr)cquantize->histogram,nim,(my_cquantize_ptr)(ulong)uVar22,
                         (boxptr)pgVar17);
              update_box((gdImagePtr)cquantize->histogram,
                         (gdImagePtr)(pgVar9->red + uVar25 * 10 + -5),cquantize_01,(boxptr)pgVar17);
              uVar25 = uVar25 + 1;
              uVar22 = uVar37;
            } while (uVar25 != uVar36);
            if (0 < (int)uVar22) goto LAB_0012000b;
          }
          local_100->colorsTotal = uVar22;
          if (-1 < *local_f8) {
            local_100->red[(int)uVar22] = (uint)*local_f8 >> 0x10 & 0xff;
            local_100->green[local_100->colorsTotal] = (uint)*(byte *)((long)&oim->transparent + 1);
            local_100->blue[local_100->colorsTotal] = (uint)(byte)*local_f8;
            local_100->alpha[local_100->colorsTotal] = 0x7f;
            local_100->open[local_100->colorsTotal] = 0;
          }
          gdFree(pgVar9);
        }
        ppahVar10 = cquantize->histogram;
        lVar24 = 0;
        do {
          memset(ppahVar10[lVar24],0,0x1000);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x20);
        if (dither == 0) {
          pass2_no_dither(oim,local_100,cquantize);
        }
        else {
          iVar21 = oim->sy;
          if (0 < (long)iVar21) {
            ppahVar10 = cquantize->histogram;
            piVar13 = cquantize->error_limiter;
            iVar20 = oim->sx;
            lVar24 = 0;
            do {
              piVar16 = oim->tpixels[lVar24];
              puVar44 = local_100->pixels[lVar24];
              if (cquantize->on_odd_row == 0) {
                psVar41 = cquantize->fserrors;
                iVar35 = 3;
                local_a0 = 1;
              }
              else {
                piVar16 = piVar16 + ((long)iVar20 + -1) * 3;
                puVar44 = puVar44 + (int)((long)iVar20 + -1);
                psVar41 = cquantize->fserrors + (iVar20 * 3 + 3);
                iVar35 = -3;
                local_a0 = -1;
              }
              iVar15 = 0;
              local_d8 = 0;
              if (iVar20 < 1) {
                sVar3 = 0;
                sVar40 = 0;
              }
              else {
                lVar29 = 0;
                iVar31 = 0;
                iVar4 = 0;
                histogram = (hist3d)0x0;
                iVar27 = 0;
                iVar2 = 0;
                iVar5 = 0;
                iVar6 = 0;
                iVar7 = 0;
                iVar28 = iVar20 + 1;
                do {
                  uVar37 = piVar16[lVar29];
                  if ((*local_f8 < 0) || (uVar37 != *local_f8)) {
                    uVar22 = (uVar37 >> 0x10 & 0xff) + piVar13[iVar15 + psVar41[iVar35] + 8 >> 4];
                    if ((int)uVar22 < 1) {
                      uVar22 = 0;
                    }
                    if (0xfe < (int)uVar22) {
                      uVar22 = 0xff;
                    }
                    uVar42 = (uVar37 >> 8 & 0xff) + piVar13[iVar31 + psVar41[iVar35 + 1] + 8 >> 4];
                    if ((int)uVar42 < 1) {
                      uVar42 = 0;
                    }
                    if (0xfe < (int)uVar42) {
                      uVar42 = 0xff;
                    }
                    uVar37 = (uVar37 & 0xff) + piVar13[iVar4 + psVar41[iVar35 + 2] + 8 >> 4];
                    if ((int)uVar37 < 1) {
                      uVar37 = 0;
                    }
                    if (0xfe < (int)uVar37) {
                      uVar37 = 0xff;
                    }
                    c1 = uVar37 >> 3;
                    lVar18 = (ulong)((uVar42 >> 2) << 6) +
                             *(long *)((long)ppahVar10 + (ulong)(uVar22 & 0xf8));
                    uVar19 = *(ushort *)(lVar18 + (ulong)c1 * 2);
                    if (uVar19 == 0) {
                      fill_inverse_cmap(local_100,(gdImagePtr)cquantize->histogram,
                                        (my_cquantize_ptr)(ulong)(uVar22 >> 3),uVar42 >> 2,c1,
                                        (int)local_100);
                      uVar19 = *(ushort *)(lVar18 + (ulong)c1 * 2);
                    }
                    puVar44[lVar29] = (char)uVar19 + 0xff;
                    uVar22 = uVar22 - local_100->red[(ulong)uVar19 - 1];
                    iVar43 = uVar42 - local_100->green[(ulong)uVar19 - 1];
                    iVar38 = uVar37 - local_100->blue[(ulong)uVar19 - 1];
                    *psVar41 = (short)uVar22 * 3 + (short)iVar5;
                    psVar41[1] = (short)iVar43 * 3 + (short)iVar6;
                    psVar41[2] = (short)iVar38 * 3 + (short)iVar7;
                    iVar5 = uVar22 * 5 + (int)histogram;
                    iVar15 = uVar22 * 7;
                    iVar6 = iVar43 * 5 + iVar27;
                    iVar31 = iVar43 * 7;
                    iVar7 = iVar38 * 5 + iVar2;
                    iVar4 = iVar38 * 7;
                    histogram = (hist3d)(ulong)uVar22;
                    iVar27 = iVar43;
                    iVar2 = iVar38;
                  }
                  else {
                    puVar44[lVar29] = (uchar)local_100->colorsTotal;
                    psVar41[0] = 0;
                    psVar41[1] = 0;
                    psVar41[2] = 0;
                    psVar41[3] = 0;
                  }
                  psVar41 = psVar41 + iVar35;
                  lVar29 = lVar29 + local_a0;
                  iVar28 = iVar28 + -1;
                } while (1 < iVar28);
                local_d8 = (short)iVar7;
                sVar3 = (short)iVar6;
                sVar40 = (short)iVar5;
              }
              *psVar41 = sVar40;
              psVar41[1] = sVar3;
              psVar41[2] = local_d8;
              lVar24 = lVar24 + 1;
            } while (lVar24 != iVar21);
          }
        }
        if (-1 < *local_f8) {
          local_100->transparent = local_100->colorsTotal;
          local_100->colorsTotal = local_100->colorsTotal + 1;
        }
        iVar21 = 1;
        if (cimP == (gdImagePtr *)0x0) {
          free_truecolor_image_data(oim);
        }
        goto LAB_0011ff8a;
      }
    }
LAB_0011ff1c:
    iVar21 = 0;
    if (oim->trueColor == 0) goto LAB_0011ff8a;
    if (cimP != (gdImagePtr *)0x0) {
      gdImageDestroy(local_100);
      *cimP = (gdImagePtr)0x0;
      iVar21 = 0;
      goto LAB_0011ff8a;
    }
    ppuVar8 = local_100->pixels;
    oim = local_100;
    if (ppuVar8 != (uchar **)0x0) {
      iVar21 = local_100->sy;
      if (0 < iVar21) {
        lVar24 = 0;
        do {
          if (local_100->pixels[lVar24] != (uchar *)0x0) {
            gdFree(local_100->pixels[lVar24]);
            iVar21 = local_100->sy;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < iVar21);
        ppuVar8 = local_100->pixels;
      }
      gdFree(ppuVar8);
    }
  }
  oim->pixels = (uchar **)0x0;
  iVar21 = 0;
LAB_0011ff8a:
  if (cquantize != (my_cquantize_ptr)0x0) {
    if (cquantize->histogram != (hist3d)0x0) {
      lVar24 = 0;
      do {
        if (cquantize->histogram[lVar24] != (hist2d)0x0) {
          gdFree(cquantize->histogram[lVar24]);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x20);
      gdFree(cquantize->histogram);
    }
    if (cquantize->fserrors != (FSERRPTR)0x0) {
      gdFree(cquantize->fserrors);
    }
    if (cquantize->error_limiter_storage != (int *)0x0) {
      gdFree(cquantize->error_limiter_storage);
    }
    gdFree(cquantize);
    return iVar21;
  }
  return iVar21;
}

Assistant:

static int gdImageTrueColorToPaletteBody (gdImagePtr oim, int dither, int colorsWanted, gdImagePtr *cimP)
{
	my_cquantize_ptr cquantize = NULL;
	int i, conversionSucceeded=0;

	/* Allocate the JPEG palette-storage */
	size_t arraysize;
	int maxColors = gdMaxColors;
	gdImagePtr nim;

	if (cimP) {
		nim = gdImageCreate(oim->sx, oim->sy);
		*cimP = nim;
		if (!nim) {
			return FALSE;
		}
	} else {
		nim = oim;
	}

	if (!oim->trueColor) {
		/* (Almost) nothing to do! */
		if (cimP) {
			gdImageCopy(nim, oim, 0, 0, 0, 0, oim->sx, oim->sy);
			*cimP = nim;
		}
		return TRUE;
	}

	/* If we have a transparent color (the alphaless mode of transparency), we
	 * must reserve a palette entry for it at the end of the palette. */
	if (oim->transparent >= 0) {
		maxColors--;
	}
	if (colorsWanted > maxColors) {
		colorsWanted = maxColors;
	}
	if (!cimP) {
		nim->pixels = gdCalloc (sizeof (unsigned char *), oim->sy);
		if (!nim->pixels) {
			/* No can do */
			goto outOfMemory;
		}
		for (i = 0; (i < nim->sy); i++) {
			nim->pixels[i] = (unsigned char *) gdCalloc (sizeof (unsigned char), oim->sx);
			if (!nim->pixels[i]) {
				goto outOfMemory;
			}
		}
	}


	if (oim->paletteQuantizationMethod == GD_QUANT_NEUQUANT) {
		if (cimP) { /* NeuQuant alwasy creates a copy, so the new blank image can't be used */
			gdImageDestroy(nim);
		}
		nim = gdImageNeuQuant(oim, colorsWanted, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 2);
		if (cimP) {
			*cimP = nim;
		} 
		if (!nim) {
			return FALSE;
		} else {
			free_truecolor_image_data(oim);
			gdImageCopy(oim, nim, 0, 0, 0, 0, oim->sx, oim->sy);
			gdImageDestroy(nim);
		}
		return TRUE;
	}


#ifdef HAVE_LIBIMAGEQUANT
	if (oim->paletteQuantizationMethod == GD_QUANT_DEFAULT ||
	        oim->paletteQuantizationMethod == GD_QUANT_LIQ) {
		liq_attr *attr = liq_attr_create_with_allocator(gdMalloc, gdFree);
		liq_image *image;
		liq_result *remap;
		int remapped_ok = 0;

		liq_set_max_colors(attr, colorsWanted);

		/* by default make it fast to match speed of previous implementation */
		liq_set_speed(attr, oim->paletteQuantizationSpeed ? oim->paletteQuantizationSpeed : 9);
		if (oim->paletteQuantizationMaxQuality) {
			liq_set_quality(attr, oim->paletteQuantizationMinQuality, oim->paletteQuantizationMaxQuality);
		}
		image = liq_image_create_custom(attr, convert_gdpixel_to_rgba, oim, oim->sx, oim->sy, 0);
		remap = liq_quantize_image(attr, image);
		if (!remap) { /* minimum quality not met, leave image unmodified */
			liq_image_destroy(image);
			liq_attr_destroy(attr);
			goto outOfMemory;
		}

		liq_set_dithering_level(remap, dither ? 1 : 0);
		if (LIQ_OK == liq_write_remapped_image_rows(remap, image, output_buf)) {
			remapped_ok = 1;
			const liq_palette *pal = liq_get_palette(remap);
			nim->transparent = -1;
			unsigned int icolor;
			for(icolor=0; icolor < pal->count; icolor++) {
				nim->open[icolor] = 0;
				nim->red[icolor] = pal->entries[icolor].r * gdRedMax/255;
				nim->green[icolor] = pal->entries[icolor].g * gdGreenMax/255;
				nim->blue[icolor] = pal->entries[icolor].b * gdBlueMax/255;
				int alpha = pal->entries[icolor].a * gdAlphaMax/255;
				if (gdAlphaOpaque < gdAlphaTransparent) {
					alpha = gdAlphaTransparent - alpha;
				}
				nim->alpha[icolor] = alpha;
				if (nim->transparent == -1 && alpha == gdAlphaTransparent) {
					nim->transparent = icolor;
				}
			}
			nim->colorsTotal = pal->count;
		}
		liq_result_destroy(remap);
		liq_image_destroy(image);
		liq_attr_destroy(attr);

		if (remapped_ok) {
			if (!cimP) {
				free_truecolor_image_data(oim);
			}
			return TRUE;
		}
	}
#endif

	cquantize = (my_cquantize_ptr) gdCalloc (sizeof (my_cquantizer), 1);
	if (!cquantize) {
		/* No can do */
		goto outOfMemory;
	}
	cquantize->fserrors = NULL;	/* flag optional arrays not allocated */
	cquantize->error_limiter = NULL;


	/* Allocate the histogram/inverse colormap storage */
	cquantize->histogram = (hist3d) gdMalloc (HIST_C0_ELEMS * sizeof (hist2d));
	for (i = 0; i < HIST_C0_ELEMS; i++) {
		cquantize->histogram[i] =
		    (hist2d) gdMalloc (HIST_C1_ELEMS * HIST_C2_ELEMS * sizeof (histcell));
		if (!cquantize->histogram[i]) {
			goto outOfMemory;
		}
	}


	cquantize->fserrors = (FSERRPTR) gdMalloc (3 * sizeof (FSERROR));
	init_error_limit (oim, nim, cquantize);
	arraysize = (size_t) ((nim->sx + 2) * (3 * sizeof (FSERROR)));
	/* Allocate Floyd-Steinberg workspace. */
	cquantize->fserrors = gdReallocEx(cquantize->fserrors, arraysize);
	if (!cquantize->fserrors) {
		goto outOfMemory;
	}
	memset(cquantize->fserrors, 0, arraysize);
	cquantize->on_odd_row = FALSE;

	/* Do the work! */
	zeroHistogram (cquantize->histogram);
	prescan_quantize (oim, nim, cquantize);
	/* TBB 2.0.5: pass colorsWanted, not 256! */
	select_colors (oim, nim, cquantize, colorsWanted);
	zeroHistogram (cquantize->histogram);
	if (dither) {
		pass2_fs_dither (oim, nim, cquantize);
	} else {
		pass2_no_dither (oim, nim, cquantize);
	}
#if 0				/* 2.0.12; we no longer attempt full alpha in palettes */
	if (cquantize->transparentIsPresent) {
		int mt = -1;
		int mtIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] > mt) {
				mtIndex = i;
				mt = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mt) {
				im->alpha[i] = gdAlphaTransparent;
			}
		}
	}
	if (cquantize->opaqueIsPresent) {
		int mo = 128;
		int moIndex = -1;
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] < mo) {
				moIndex = i;
				mo = im->alpha[i];
			}
		}
		for (i = 0; (i < im->colorsTotal); i++) {
			if (im->alpha[i] == mo) {
				im->alpha[i] = gdAlphaOpaque;
			}
		}
	}
#endif

	/* If we had a 'transparent' color, increment the color count so it's
	 * officially in the palette and convert the transparent variable to point to
	 * an index rather than a color (Its data already exists and transparent
	 * pixels have already been mapped to it by this point, it is done late as to
	 * avoid color matching / dithering with it). */
	if (oim->transparent >= 0) {
		nim->transparent = nim->colorsTotal;
		nim->colorsTotal++;
	}

	/* Success! Get rid of the truecolor image data. */
	conversionSucceeded = TRUE;
	if (!cimP) {
		free_truecolor_image_data(oim);
	}

	goto freeQuantizeData;
	/* Tediously free stuff. */
outOfMemory:
	conversionSucceeded = FALSE;
	if (oim->trueColor) {
		if (!cimP) {
			/* On failure only */
			if (nim->pixels) {
				for (i = 0; i < nim->sy; i++) {
					if (nim->pixels[i]) {
						gdFree (nim->pixels[i]);
					}
				}
				gdFree (nim->pixels);
			}
			nim->pixels = NULL;
		} else {
			gdImageDestroy(nim);
			*cimP = 0;
		}
	}

freeQuantizeData:
	if (cquantize) {
		if (cquantize->histogram) {
			for (i = 0; i < HIST_C0_ELEMS; i++) {
				if (cquantize->histogram[i]) {
					gdFree (cquantize->histogram[i]);
				}
			}
			gdFree (cquantize->histogram);
		}
		if (cquantize->fserrors) {
			gdFree (cquantize->fserrors);
		}
		if (cquantize->error_limiter_storage) {
			gdFree (cquantize->error_limiter_storage);
		}
		gdFree (cquantize);
	}

	return conversionSucceeded;
}